

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O2

void __thiscall
bal::GraphMLWeightedStreamWriter::write_header(GraphMLWeightedStreamWriter *this,Cnf *value)

{
  ostream *poVar1;
  
  GraphMLStreamWriter::write_header(&this->super_GraphMLStreamWriter,value);
  poVar1 = std::operator<<((this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_,
                           "<key id=\"e_cardinality\" for=\"edge\" attr.name=\"cardinality\" attr.type=\"int\"/>"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((this->super_GraphMLStreamWriter).super_StreamWriter<bal::Cnf>.stream_,
                           "<key id=\"e_weight\" for=\"edge\" attr.name=\"weight\" attr.type=\"double\"/>"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

virtual void write_header(const Cnf& value) override {
            GraphMLStreamWriter::write_header(value);
            stream() << "<key id=\"e_cardinality\" for=\"edge\" attr.name=\"cardinality\" attr.type=\"int\"/>" << std::endl;
            stream() << "<key id=\"e_weight\" for=\"edge\" attr.name=\"weight\" attr.type=\"double\"/>" << std::endl;
        }